

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::print<char_const*>(ConsoleLogger *this,char **t)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  std::operator<<((ostream *)*in_RDI,(char *)*in_RSI);
  print((ConsoleLogger *)0x13eb70);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}